

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

unsigned_long __thiscall
lodepng::ExtractZlib::huffmanDecodeSymbol
          (ExtractZlib *this,uchar *in,size_t *bp,HuffmanTree *tree,size_t inlength)

{
  byte bVar1;
  pointer puVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  
  puVar2 = (tree->tree2d).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(tree->tree2d).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2 >> 3) >> 1;
  uVar7 = 0;
  sVar6 = *bp;
  do {
    if ((sVar6 & 7) == 0 && inlength < sVar6 >> 3) {
      iVar4 = 10;
LAB_00120b49:
      this->error = iVar4;
      return 0;
    }
    bVar1 = in[sVar6 >> 3];
    *bp = sVar6 + 1;
    if (uVar5 <= uVar7) {
      iVar4 = 0xb;
      goto LAB_00120b49;
    }
    uVar3 = puVar2[uVar7 * 2 + (ulong)((bVar1 >> ((uint)sVar6 & 7) & 1) != 0)];
    this->error = 0;
    uVar7 = uVar3 - uVar5;
    sVar6 = sVar6 + 1;
    if (uVar3 < uVar5) {
      return uVar3;
    }
  } while( true );
}

Assistant:

unsigned long huffmanDecodeSymbol(const unsigned char* in, size_t& bp, const HuffmanTree& tree, size_t inlength) {
    //decode a single symbol from given list of bits with given code tree. return value is the symbol
    bool decoded; unsigned long ct;
    for(size_t treepos = 0;;) {
      if((bp & 0x07) == 0 && (bp >> 3) > inlength) { error = 10; return 0; } //error: end reached without endcode
      error = tree.decode(decoded, ct, treepos, readBitFromStream(bp, in));
      if(error) return 0; //stop, an error happened
      if(decoded) return ct;
    }
  }